

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileParser::~cmListFileParser(cmListFileParser *this)

{
  cmListFileParser *this_local;
  
  cmListFileLexer_Delete(this->Lexer);
  cmListFileFunction::~cmListFileFunction(&this->Function);
  return;
}

Assistant:

cmListFileParser::~cmListFileParser()
{
  cmListFileLexer_Delete(this->Lexer);
}